

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O1

SRes ReadTime(CSzBitUi64s *p,UInt32 num,CSzData *sd2,CBuf *tempBufs,UInt32 numTempBufs,
             ISzAlloc *alloc)

{
  Byte BVar1;
  Byte *pBVar2;
  bool bVar3;
  SRes SVar4;
  CNtfsFileTime *pCVar5;
  UInt32 *pUVar6;
  ulong uVar7;
  size_t sVar8;
  UInt32 index;
  uint local_44;
  CSzData *local_40;
  CBuf *local_38;
  
  local_38 = tempBufs;
  SVar4 = ReadBitVector(sd2,num,&p->Defs,alloc);
  if (SVar4 != 0) {
    return SVar4;
  }
  if (sd2->Size == 0) {
    return 0x10;
  }
  sVar8 = sd2->Size - 1;
  sd2->Size = sVar8;
  pBVar2 = sd2->Data;
  pUVar6 = (UInt32 *)(pBVar2 + 1);
  sd2->Data = (Byte *)pUVar6;
  BVar1 = *pBVar2;
  local_40 = sd2;
  if (BVar1 == '\0') goto LAB_0070a7d4;
  SVar4 = SzReadNumber32(sd2,&local_44);
  if (SVar4 == 0) {
    if (numTempBufs <= local_44) {
      SVar4 = 0x10;
      goto LAB_0070a7ca;
    }
    pUVar6 = (UInt32 *)local_38[local_44].data;
    sVar8 = local_38[local_44].size;
    bVar3 = true;
    SVar4 = 0;
  }
  else {
LAB_0070a7ca:
    bVar3 = false;
  }
  if (!bVar3) {
    return SVar4;
  }
LAB_0070a7d4:
  if (num == 0) {
    p->Vals = (CNtfsFileTime *)0x0;
  }
  else {
    pCVar5 = (CNtfsFileTime *)(*alloc->Alloc)(alloc,(ulong)num * 8);
    p->Vals = pCVar5;
    if (pCVar5 == (CNtfsFileTime *)0x0) {
      return 2;
    }
  }
  if (num != 0) {
    pBVar2 = p->Defs;
    pCVar5 = p->Vals;
    uVar7 = 0;
    do {
      if ((char)(pBVar2[uVar7 >> 3 & 0x1fffffff] << ((byte)uVar7 & 7)) < '\0') {
        if (sVar8 < 8) {
          return 0x10;
        }
        pCVar5[uVar7].Low = *pUVar6;
        pCVar5[uVar7].High = pUVar6[1];
        sVar8 = sVar8 - 8;
        pUVar6 = pUVar6 + 2;
      }
      else {
        pCVar5[uVar7].Low = 0;
        pCVar5[uVar7].High = 0;
      }
      uVar7 = uVar7 + 1;
    } while (num != uVar7);
  }
  if (BVar1 == '\0') {
    local_40->Data = (Byte *)pUVar6;
    local_40->Size = sVar8;
  }
  return 0;
}

Assistant:

static MY_NO_INLINE SRes ReadTime(CSzBitUi64s *p, UInt32 num,
    CSzData *sd2,
    const CBuf *tempBufs, UInt32 numTempBufs,
    ISzAlloc *alloc)
{
  CSzData sd;
  UInt32 i;
  CNtfsFileTime *vals;
  Byte *defs;
  Byte external;
  
  RINOK(ReadBitVector(sd2, num, &p->Defs, alloc));
  
  SZ_READ_BYTE_SD(sd2, external);
  if (external == 0)
    sd = *sd2;
  else
  {
    UInt32 index;
    RINOK(SzReadNumber32(sd2, &index));
    if (index >= numTempBufs)
      return SZ_ERROR_ARCHIVE;
    sd.Data = tempBufs[index].data;
    sd.Size = tempBufs[index].size;
  }
  
  MY_ALLOC_ZE(CNtfsFileTime, p->Vals, num, alloc);
  vals = p->Vals;
  defs = p->Defs;
  for (i = 0; i < num; i++)
    if (SzBitArray_Check(defs, i))
    {
      if (sd.Size < 8)
        return SZ_ERROR_ARCHIVE;
      vals[i].Low = GetUi32(sd.Data);
      vals[i].High = GetUi32(sd.Data + 4);
      SKIP_DATA2(sd, 8);
    }
    else
      vals[i].High = vals[i].Low = 0;
  
  if (external == 0)
    *sd2 = sd;
  
  return SZ_OK;
}